

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

WhereTerm * whereScanNext(WhereScan *pScan)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  int iTab;
  Parse *pParse;
  int iVar4;
  uint uVar5;
  CollSeq *pCVar6;
  ExprList_item *pEVar7;
  Expr *pEVar8;
  ulong uVar9;
  long lVar10;
  WhereClause *pWVar11;
  WhereTerm *pWVar12;
  int iVar13;
  
  iVar13 = pScan->k;
  pWVar11 = pScan->pWC;
  do {
    sVar3 = pScan->aiColumn[(ulong)pScan->iEquiv - 1];
    iTab = pScan->aiCur[(ulong)pScan->iEquiv - 1];
    do {
      if (iVar13 < pWVar11->nTerm) {
        pWVar12 = pWVar11->a + iVar13;
LAB_0019180d:
        if ((((pWVar12->leftCursor == iTab) && ((pWVar12->u).x.leftColumn == (int)sVar3)) &&
            ((sVar3 != -2 ||
             (iVar4 = sqlite3ExprCompareSkip(pWVar12->pExpr->pLeft,pScan->pIdxExpr,iTab), iVar4 == 0
             )))) && ((pScan->iEquiv < 2 || ((pWVar12->pExpr->flags & 1) == 0)))) {
          if (((pWVar12->eOperator & 0x800) != 0) && (bVar1 = pScan->nEquiv, bVar1 < 0xb)) {
            pEVar8 = pWVar12->pExpr->pRight;
            while ((pEVar8 != (Expr *)0x0 && ((pEVar8->flags & 0x82000) != 0))) {
              if ((pEVar8->flags >> 0x13 & 1) == 0) {
                pEVar7 = (ExprList_item *)&pEVar8->pLeft;
              }
              else {
                pEVar7 = ((pEVar8->x).pList)->a;
              }
              pEVar8 = pEVar7->pExpr;
            }
            if (((pEVar8 == (Expr *)0x0) || (pEVar8->op != 0xa7)) || ((pEVar8->flags & 0x20) != 0))
            {
              pEVar8 = (Expr *)0x0;
            }
            if (pEVar8 != (Expr *)0x0) {
              uVar5 = (uint)bVar1;
              if (bVar1 == 0) {
                uVar9 = 0;
              }
              else {
                uVar9 = 0;
                do {
                  if ((pScan->aiCur[uVar9] == pEVar8->iTable) &&
                     (pScan->aiColumn[uVar9] == pEVar8->iColumn)) goto LAB_001918e5;
                  uVar9 = uVar9 + 1;
                } while (uVar5 != uVar9);
                uVar9 = (ulong)uVar5;
              }
LAB_001918e5:
              if ((uint)uVar9 == uVar5) {
                pScan->aiCur[uVar9 & 0xffffffff] = pEVar8->iTable;
                pScan->aiColumn[uVar9 & 0xffffffff] = pEVar8->iColumn;
                pScan->nEquiv = bVar1 + 1;
              }
            }
          }
          if ((pScan->opMask & (uint)pWVar12->eOperator) == 0) goto LAB_001919d0;
          if (((pWVar12->eOperator >> 8 & 1) == 0) && (pScan->zCollName != (char *)0x0)) {
            pParse = pWVar11->pWInfo->pParse;
            pEVar8 = pWVar12->pExpr;
            iVar4 = sqlite3IndexAffinityOk(pEVar8,pScan->idxaff);
            if (iVar4 != 0) {
              pCVar6 = sqlite3ExprCompareCollSeq(pParse,pEVar8);
              if (pCVar6 == (CollSeq *)0x0) {
                pCVar6 = pParse->db->pDfltColl;
              }
              lVar10 = 0;
              do {
                bVar1 = pCVar6->zName[lVar10];
                bVar2 = pScan->zCollName[lVar10];
                if (bVar1 == bVar2) {
                  if ((ulong)bVar1 == 0) goto LAB_0019199c;
                }
                else if (""[bVar1] != ""[bVar2]) goto LAB_0019199c;
                lVar10 = lVar10 + 1;
              } while( true );
            }
            goto LAB_001919d0;
          }
          goto LAB_001919a6;
        }
        goto LAB_001919d0;
      }
LAB_001919e1:
      pWVar11 = pWVar11->pOuter;
      iVar13 = 0;
    } while (pWVar11 != (WhereClause *)0x0);
    if (pScan->nEquiv <= pScan->iEquiv) {
      return (WhereTerm *)0x0;
    }
    pWVar11 = pScan->pOrigWC;
    pScan->iEquiv = pScan->iEquiv + 1;
    iVar13 = 0;
  } while( true );
LAB_0019199c:
  if (bVar1 == bVar2) {
LAB_001919a6:
    if (((((pWVar12->eOperator & 0x82) == 0) ||
         (pEVar8 = pWVar12->pExpr->pRight, pEVar8 == (Expr *)0x0)) || (pEVar8->op != 0xa7)) ||
       ((pEVar8->iTable != pScan->aiCur[0] || (pEVar8->iColumn != pScan->aiColumn[0])))) {
      pScan->pWC = pWVar11;
      pScan->k = iVar13 + 1;
      return pWVar12;
    }
  }
LAB_001919d0:
  iVar13 = iVar13 + 1;
  pWVar12 = pWVar12 + 1;
  if (pWVar11->nTerm <= iVar13) goto LAB_001919e1;
  goto LAB_0019180d;
}

Assistant:

static WhereTerm *whereScanNext(WhereScan *pScan){
  int iCur;            /* The cursor on the LHS of the term */
  i16 iColumn;         /* The column on the LHS of the term.  -1 for IPK */
  Expr *pX;            /* An expression being tested */
  WhereClause *pWC;    /* Shorthand for pScan->pWC */
  WhereTerm *pTerm;    /* The term being tested */
  int k = pScan->k;    /* Where to start scanning */

  assert( pScan->iEquiv<=pScan->nEquiv );
  pWC = pScan->pWC;
  while(1){
    iColumn = pScan->aiColumn[pScan->iEquiv-1];
    iCur = pScan->aiCur[pScan->iEquiv-1];
    assert( pWC!=0 );
    assert( iCur>=0 );
    do{
      for(pTerm=pWC->a+k; k<pWC->nTerm; k++, pTerm++){
        assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 || pTerm->leftCursor<0 );
        if( pTerm->leftCursor==iCur
         && pTerm->u.x.leftColumn==iColumn
         && (iColumn!=XN_EXPR
             || sqlite3ExprCompareSkip(pTerm->pExpr->pLeft,
                                       pScan->pIdxExpr,iCur)==0)
         && (pScan->iEquiv<=1 || !ExprHasProperty(pTerm->pExpr, EP_OuterON))
        ){
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && pScan->nEquiv<ArraySize(pScan->aiCur)
           && (pX = whereRightSubexprIsColumn(pTerm->pExpr))!=0
          ){
            int j;
            for(j=0; j<pScan->nEquiv; j++){
              if( pScan->aiCur[j]==pX->iTable
               && pScan->aiColumn[j]==pX->iColumn ){
                  break;
              }
            }
            if( j==pScan->nEquiv ){
              pScan->aiCur[j] = pX->iTable;
              pScan->aiColumn[j] = pX->iColumn;
              pScan->nEquiv++;
            }
          }
          if( (pTerm->eOperator & pScan->opMask)!=0 ){
            /* Verify the affinity and collating sequence match */
            if( pScan->zCollName && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              Parse *pParse = pWC->pWInfo->pParse;
              pX = pTerm->pExpr;
              if( !sqlite3IndexAffinityOk(pX, pScan->idxaff) ){
                continue;
              }
              assert(pX->pLeft);
              pColl = sqlite3ExprCompareCollSeq(pParse, pX);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
              if( sqlite3StrICmp(pColl->zName, pScan->zCollName) ){
                continue;
              }
            }
            if( (pTerm->eOperator & (WO_EQ|WO_IS))!=0
             && (pX = pTerm->pExpr->pRight, ALWAYS(pX!=0))
             && pX->op==TK_COLUMN
             && pX->iTable==pScan->aiCur[0]
             && pX->iColumn==pScan->aiColumn[0]
            ){
              testcase( pTerm->eOperator & WO_IS );
              continue;
            }
            pScan->pWC = pWC;
            pScan->k = k+1;
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x20000 ){
              int ii;
              sqlite3DebugPrintf("SCAN-TERM %p: nEquiv=%d",
                 pTerm, pScan->nEquiv);
              for(ii=0; ii<pScan->nEquiv; ii++){
                sqlite3DebugPrintf(" {%d:%d}",
                   pScan->aiCur[ii], pScan->aiColumn[ii]);
              }
              sqlite3DebugPrintf("\n");
            }
#endif
            return pTerm;
          }
        }
      }
      pWC = pWC->pOuter;
      k = 0;
    }while( pWC!=0 );
    if( pScan->iEquiv>=pScan->nEquiv ) break;
    pWC = pScan->pOrigWC;
    k = 0;
    pScan->iEquiv++;
  }
  return 0;
}